

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.h
# Opt level: O2

ssize_t __thiscall
LatencySimulator::send(LatencySimulator *this,int __fd,void *__buf,size_t __n,int __flags)

{
  uint32_t uVar1;
  int iVar2;
  long lVar3;
  DelayPacket *this_00;
  ssize_t extraout_RAX;
  DelayTunnel *this_01;
  int iVar4;
  DelayPacket *pkt;
  
  if (__fd == 1) {
    this->tx1 = this->tx1 + 1;
    lVar3 = Random::random(&this->r12);
    if ((int)lVar3 < this->lostrate) {
      return lVar3;
    }
    if (this->nmax <=
        (int)(this->p12).super__List_base<DelayPacket_*,_std::allocator<DelayPacket_*>_>._M_impl.
             _M_node._M_size) {
      return (ulong)(uint)this->nmax;
    }
  }
  else {
    this->tx2 = this->tx2 + 1;
    lVar3 = Random::random(&this->r21);
    if ((int)lVar3 < this->lostrate) {
      return lVar3;
    }
    if (this->nmax <=
        (int)(this->p21).super__List_base<DelayPacket_*,_std::allocator<DelayPacket_*>_>._M_impl.
             _M_node._M_size) {
      return (ulong)(uint)this->nmax;
    }
  }
  this_00 = (DelayPacket *)operator_new(0x18);
  DelayPacket::DelayPacket(this_00,(int)__n,__buf);
  pkt = this_00;
  uVar1 = iclock();
  this->current = uVar1;
  iVar4 = this->rttmin;
  if (iVar4 < this->rttmax) {
    iVar2 = rand();
    uVar1 = this->current;
    iVar4 = iVar4 + iVar2 % (this->rttmax - this->rttmin);
  }
  this_00->_ts = uVar1 + iVar4;
  this_01 = &this->p12;
  if (__fd != 1) {
    this_01 = &this->p21;
  }
  std::__cxx11::list<DelayPacket_*,_std::allocator<DelayPacket_*>_>::push_back(this_01,&pkt);
  return extraout_RAX;
}

Assistant:

void send(int peer, const void *data, int size) {
//        DelayTunnel &tunnel = p12;
//        Random &r = r12;
//        tx1++;
        DelayTunnel *tunnel = &p12;
        if (peer == 1) {
            tx1++;
            if (r12.random() < lostrate) {
//                fprintf(stderr, "drop. lost rate test.\n");
                return;
            }
            if ((int) p12.size() >= nmax) return;
        } else {
            tunnel = &p21;
            tx2++;
            if (r21.random() < lostrate) {
//                fprintf(stderr, "drop. lost rate test.\n");
                return;  //todo: uncoment for lost rate test
            }
            if ((int) p21.size() >= nmax) return;
        }


        DelayPacket *pkt = new DelayPacket(size, data);
        current = iclock();
        uint32_t delay = rttmin;
        if (rttmax > rttmin) delay += rand() % (rttmax - rttmin);
//		fprintf(stderr, "delay: %dms\n", delay);
        pkt->setts(current + delay);
        if (peer == 1) {
//            if (!(tx1 % 3)) {    // simulate packet loss
//                fprintf(stderr, "peer 1 send: drop packt. tx1 = %d\n", tx1);
//                delete pkt;
//                return;
//            }
            p12.push_back(pkt);
        } else {
//            if (!(tx2 % 5)) {
//                fprintf(stderr, "peer 2 send: drop packt. tx2 = %d\n", tx2);
//                delete pkt;
//                return;
//            }
            p21.push_back(pkt);
        }

//        fprintf(stderr, "send, tunnel: %p, size: %d, pkt: %p, _ptr: %p\n", tunnel, tunnel->size(),  pkt, pkt->ptr());

    }